

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

CoeffReturnType __thiscall
Eigen::internal::
product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
::coeff(product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        *this,Index row,Index col)

{
  Scalar SVar1;
  Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true> local_e8;
  Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> local_b8;
  PointerType local_88 [2];
  XprTypeNested local_78;
  long lStack_70;
  long local_68;
  Index IStack_60;
  PointerType local_58;
  undefined8 uStack_50;
  XprTypeNested local_48;
  long lStack_40;
  undefined8 local_38;
  Index IStack_30;
  
  Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>::Block(&local_b8,this->m_lhs,row);
  Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true>::Block(&local_e8,this->m_rhs,col);
  local_68 = local_b8.
             super_BlockImpl<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
             super_BlockImpl_dense<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
             m_startCol.m_value;
  IStack_60 = local_b8.
              super_BlockImpl<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>
              .super_BlockImpl_dense<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
              m_outerStride;
  local_78 = local_b8.
             super_BlockImpl<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
             super_BlockImpl_dense<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
             m_xpr;
  lStack_70 = local_b8.
              super_BlockImpl<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>
              .super_BlockImpl_dense<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
              m_startRow.m_value;
  local_88[0] = local_b8.
                super_BlockImpl<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>
                .
                super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>
                .m_data;
  local_88[1] = (PointerType)
                local_b8.
                super_BlockImpl<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>
                .
                super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>
                ._8_8_;
  local_58 = local_e8.
             super_BlockImpl<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true,_true>.
             super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true>,_0>.
             m_data;
  uStack_50 = local_e8.
              super_BlockImpl<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true,_Eigen::Dense>.
              super_BlockImpl_dense<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true,_true>.
              super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true>,_0>
              ._8_8_;
  local_48 = local_e8.
             super_BlockImpl<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true,_true>.
             m_xpr;
  lStack_40 = local_e8.
              super_BlockImpl<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true,_Eigen::Dense>.
              super_BlockImpl_dense<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true,_true>.
              m_startRow.m_value;
  local_38 = local_e8.
             super_BlockImpl<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true,_true>.
             _32_8_;
  IStack_30 = local_e8.
              super_BlockImpl<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true,_Eigen::Dense>.
              super_BlockImpl_dense<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true,_true>.
              m_outerStride;
  SVar1 = DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true>_>_>
          ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true>_>_>
                 *)local_88);
  return SVar1;
}

Assistant:

const CoeffReturnType coeff(Index row, Index col) const
  {
    return (m_lhs.row(row).transpose().cwiseProduct( m_rhs.col(col) )).sum();
  }